

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  ulong uVar1;
  bool bVar2;
  GLuint GVar3;
  reference pvVar4;
  float *pfVar5;
  size_type sVar6;
  CallLogWrapper *this_01;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  ulong local_a0;
  size_t i;
  undefined1 local_90 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  undefined1 local_70 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedSharedIndexing *this_local;
  
  local_20 = 
  "\nlayout(binding = 3, rgba32f) uniform image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true = true;\nuniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0, 1, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);\n\n  if (g_true && gl_LocalInvocationID.x < 10) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(binding = 3, rgba32f) uniform image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true = true;\nuniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0, 1, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);\n\n  if (g_true && gl_LocalInvocationID.x < 10) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,&local_41);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar2) {
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70,
               0x10,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&data_1.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_texture);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2601);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_70,0);
    pfVar5 = tcu::Vector<float,_4>::operator[](pvVar4,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8814,4,4,0,0x1908,0x1406,pfVar5);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70);
    this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glBindImageTexture(this_01,3,this->m_texture,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram(this_01,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_01,1,1,1);
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90,
               0x10,(allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x100);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_90,0);
    pfVar5 = tcu::Vector<float,_4>::operator[](pvVar4,0);
    glu::CallLogWrapper::glGetTexImage
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x1908,0x1406,pfVar5);
    for (local_a0 = 0; uVar1 = local_a0,
        sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_90), uVar1 < sVar6; local_a0 = local_a0 + 1) {
      pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_90,local_a0);
      tcu::Vector<float,_4>::Vector(&local_b0,pvVar4);
      tcu::Vector<float,_4>::Vector(&local_c0,0.0,1.0,0.0,1.0);
      bVar2 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_b0,&local_c0);
      if (!bVar2) {
        anon_unknown_0::Output("Invalid data at index %d.\n",local_a0);
        this_local = (AdvancedSharedIndexing *)&DAT_ffffffffffffffff;
        bVar2 = true;
        goto LAB_00f7fa26;
      }
    }
    bVar2 = false;
LAB_00f7fa26:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90);
    if (!bVar2) {
      this_local = (AdvancedSharedIndexing *)0x0;
    }
  }
  else {
    this_local = (AdvancedSharedIndexing *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(binding = 3, rgba32f) uniform image2D g_result_image;" NL
			"layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			"shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			"shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			"uniform bool g_true = true;" NL
			"uniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };" NL NL
			"void Sync() {" NL "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL
			"void SetMemory(ivec2 xy, float value) {" NL "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL
			"  g_shared2[xy.y][xy.x] = value;" NL "  g_shared3[xy[1]].data[xy[0]] = value;" NL
			"  g_shared4[xy.y].data[xy[0]] = value;" NL
			"  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			"bool CheckMemory(ivec2 xy, float expected) {" NL
			"  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			"  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			"  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			"  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			"  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			"void main() {" NL "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			"  vec4 result = vec4(0, 1, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  if (g_true && gl_LocalInvocationID.x < 10) {" NL
			"    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			"    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);" NL
			"  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<vec4> data(4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}